

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceOuterBound::~IfcFaceOuterBound(IfcFaceOuterBound *this)

{
  char *pcVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcFaceBound).super_IfcTopologicalRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  pcVar1 = (this->super_IfcFaceBound).Orientation.field_2._M_local_buf + (long)p_Var2;
  pcVar1[-0x48] = -0x68;
  pcVar1[-0x47] = -0x35;
  pcVar1[-0x46] = -0x75;
  pcVar1[-0x45] = '\0';
  pcVar1[-0x44] = '\0';
  pcVar1[-0x43] = '\0';
  pcVar1[-0x42] = '\0';
  pcVar1[-0x41] = '\0';
  pcVar1[0x20] = '\x10';
  pcVar1[0x21] = -0x34;
  pcVar1[0x22] = -0x75;
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[-0x38] = -0x40;
  pcVar1[-0x37] = -0x35;
  pcVar1[-0x36] = -0x75;
  pcVar1[-0x35] = '\0';
  pcVar1[-0x34] = '\0';
  pcVar1[-0x33] = '\0';
  pcVar1[-0x32] = '\0';
  pcVar1[-0x31] = '\0';
  pcVar1[-0x28] = -0x18;
  pcVar1[-0x27] = -0x35;
  pcVar1[-0x26] = -0x75;
  pcVar1[-0x25] = '\0';
  pcVar1[-0x24] = '\0';
  pcVar1[-0x23] = '\0';
  pcVar1[-0x22] = '\0';
  pcVar1[-0x21] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcFaceBound).super_IfcTopologicalRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcFaceOuterBound() : Object("IfcFaceOuterBound") {}